

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmganalysis.cpp
# Opt level: O3

void __thiscall TPZMGAnalysis::SolveInternal<double>(TPZMGAnalysis *this)

{
  TPZSolutionMatrix *this_00;
  TPZFMatrix<std::complex<double>_> *A;
  ESolType EVar1;
  ulong uVar2;
  long *plVar3;
  TPZBaseMatrix *pTVar4;
  TPZMatrix<double> *pTVar5;
  int iVar6;
  undefined4 extraout_var;
  int64_t iVar7;
  TPZFMatrix<double> *pTVar8;
  TPZFMatrix<double> *pTVar9;
  TPZSolutionMatrix *pTVar10;
  long lVar11;
  ostream *poVar12;
  long *plVar13;
  double dVar14;
  double extraout_XMM0_Qa;
  TPZFMatrix<double> residual;
  TPZAutoPointer<TPZMatrix<double>_> local_168;
  double local_160;
  int64_t local_158;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  if ((this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNElements
      == 1) {
    TPZLinearAnalysis::Solve(&this->super_TPZLinearAnalysis);
    if ((this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
        super_TPZVec<TPZMatrixSolver<double>_*>.fNElements == 0) {
      iVar6 = (*(((this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolver)->super_TPZSavable).
                _vptr_TPZSavable[9])();
      (*(this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
        super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec[3])
                (&this->fSolvers,
                 (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
                 super_TPZVec<TPZMatrixSolver<double>_*>.fNElements + 1);
      (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
      super_TPZVec<TPZMatrixSolver<double>_*>.fStore
      [(this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
       super_TPZVec<TPZMatrixSolver<double>_*>.fNElements + -1] =
           (TPZMatrixSolver<double> *)CONCAT44(extraout_var,iVar6);
    }
    if ((this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
        super_TPZVec<TPZMatrixSolver<double>_*>.fNElements == 0) {
      (*(this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
        super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec[3])(&this->fPrecondition,1);
      (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
      super_TPZVec<TPZMatrixSolver<double>_*>.fStore
      [(this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
       super_TPZVec<TPZMatrixSolver<double>_*>.fNElements + -1] = (TPZMatrixSolver<double> *)0x0;
    }
    lVar11 = (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
             super_TPZVec<TPZSolutionMatrix_*>.fNElements;
    if (lVar11 == 0) {
      pTVar10 = (TPZSolutionMatrix *)operator_new(0x138);
      TPZSolutionMatrix::TPZSolutionMatrix
                (pTVar10,&(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution);
      (*(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
        super_TPZVec<TPZSolutionMatrix_*>._vptr_TPZVec[3])
                (&this->fSolutions,
                 (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                 super_TPZVec<TPZSolutionMatrix_*>.fNElements + 1);
      (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
      super_TPZVec<TPZSolutionMatrix_*>.fStore
      [(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
       super_TPZVec<TPZSolutionMatrix_*>.fNElements + -1] = pTVar10;
      return;
    }
    TPZSolutionMatrix::operator=
              (*(TPZSolutionMatrix **)
                ((long)(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                       super_TPZVec<TPZSolutionMatrix_*>.fStore +
                ((lVar11 << 0x20) + -0x100000000 >> 0x1d)),
               &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution);
    return;
  }
  iVar7 = TPZCompMesh::NEquations((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh);
  uVar2 = ((this->super_TPZLinearAnalysis).fRhs.fBaseMatrix)->fRow;
  if (uVar2 != (long)(int)iVar7) {
    return;
  }
  pTVar10 = &(this->super_TPZLinearAnalysis).fRhs;
  lVar11 = (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
           super_TPZVec<TPZMatrixSolver<double>_*>.fNElements;
  pTVar8 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(pTVar10);
  TPZFMatrix<double>::TPZFMatrix(&local_c0,pTVar8);
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar2;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  if ((iVar7 << 0x20 != 0) &&
     (local_150.fElem =
           (double *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | (iVar7 << 0x20) >> 0x1d),
     0 < (long)uVar2)) {
    memset(local_150.fElem,0,uVar2 * 8);
  }
  plVar3 = *(long **)((long)(this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
                            super_TPZVec<TPZMatrixSolver<double>_*>.fStore +
                     ((lVar11 << 0x20) + -0x100000000 >> 0x1d));
  this_00 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution;
  pTVar4 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fBaseMatrix;
  local_158 = iVar7;
  if (pTVar4->fRow == uVar2) {
    local_168.fRef = (TPZReference *)plVar3[0x14];
    LOCK();
    ((local_168.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_168.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pTVar5 = (local_168.fRef)->fPointer;
    pTVar8 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_00);
    pTVar9 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(pTVar10);
    (*(pTVar5->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])
              (pTVar5,pTVar8,pTVar9,&local_c0);
    TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_168);
  }
  else {
    (*(pTVar4->super_TPZSavable)._vptr_TPZSavable[0xe])(pTVar4,uVar2,1);
  }
  EVar1 = (this->super_TPZLinearAnalysis).fRhs.fSolType;
  if (EVar1 == EComplex) {
    A = &(this->super_TPZLinearAnalysis).fRhs.fComplexMatrix;
    Dot<std::complex<double>>(A,A);
    dVar14 = extraout_XMM0_Qa;
  }
  else {
    if (EVar1 != EReal) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"STATE Norm(const TPZSolutionMatrix &)",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Type is not set. Aborting...\n",0x1d);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZSolutionMatrix.h"
                 ,0x98);
    }
    pTVar8 = &(this->super_TPZLinearAnalysis).fRhs.fRealMatrix;
    dVar14 = Dot<double>(pTVar8,pTVar8);
  }
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  local_160 = Dot<double>(&local_c0,&local_c0);
  if (local_160 < 0.0) {
    local_160 = sqrt(local_160);
  }
  else {
    local_160 = SQRT(local_160);
  }
  if (local_160 <= dVar14 * 1e-06) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZMGAnalysis::Solve no need for iterations normrhs = ",0x36);
    poVar12 = std::ostream::_M_insert<double>(dVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," normres = ",0xb);
    poVar12 = std::ostream::_M_insert<double>(local_160);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    lVar11 = (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
             super_TPZVec<TPZSolutionMatrix_*>.fNElements;
    if ((this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNElements
        <= lVar11) {
      TPZSolutionMatrix::operator=
                (*(TPZSolutionMatrix **)
                  ((long)(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                         super_TPZVec<TPZSolutionMatrix_*>.fStore +
                  ((lVar11 << 0x20) + -0x100000000 >> 0x1d)),this_00);
      goto LAB_0126d13c;
    }
    pTVar10 = (TPZSolutionMatrix *)operator_new(0x138);
    TPZSolutionMatrix::TPZSolutionMatrix(pTVar10,this_00);
    (*(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
      super_TPZVec<TPZSolutionMatrix_*>._vptr_TPZVec[3])
              (&this->fSolutions,
               (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
               super_TPZVec<TPZSolutionMatrix_*>.fNElements + 1);
  }
  else {
    if ((plVar3 != (long *)0x0) &&
       (lVar11 = __dynamic_cast(plVar3,&TPZMatrixSolver<double>::typeinfo,
                                &TPZStepSolver<double>::typeinfo,0), lVar11 != 0)) {
      *(double *)(lVar11 + 200) = (dVar14 * 1e-06) / local_160;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZMGAnalysis::Run res : ",0x19);
    dVar14 = Dot<double>(&local_c0,&local_c0);
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    poVar12 = std::ostream::_M_insert<double>(dVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," neq ",5);
    plVar13 = (long *)std::ostream::operator<<(poVar12,(int)local_158);
    std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
    std::ostream::put((char)plVar13);
    std::ostream::flush();
    (**(code **)(*plVar3 + 0x58))(plVar3,&local_c0,&local_150,0);
    pTVar8 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_00);
    TPZFMatrix<double>::operator+=(pTVar8,&local_150.super_TPZMatrix<double>);
    TPZCompMesh::LoadSolution((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh,this_00);
    lVar11 = (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
             super_TPZVec<TPZSolutionMatrix_*>.fNElements;
    if ((this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.fNElements
        <= lVar11) {
      TPZSolutionMatrix::operator=
                (*(TPZSolutionMatrix **)
                  ((long)(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
                         super_TPZVec<TPZSolutionMatrix_*>.fStore +
                  ((lVar11 << 0x20) + -0x100000000 >> 0x1d)),this_00);
      goto LAB_0126d13c;
    }
    pTVar10 = (TPZSolutionMatrix *)operator_new(0x138);
    TPZSolutionMatrix::TPZSolutionMatrix(pTVar10,this_00);
    (*(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
      super_TPZVec<TPZSolutionMatrix_*>._vptr_TPZVec[3])
              (&this->fSolutions,
               (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
               super_TPZVec<TPZSolutionMatrix_*>.fNElements + 1);
  }
  (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.super_TPZVec<TPZSolutionMatrix_*>.
  fStore[(this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.
         super_TPZVec<TPZSolutionMatrix_*>.fNElements + -1] = pTVar10;
LAB_0126d13c:
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZMGAnalysis::SolveInternal()
{
  if(fMeshes.NElements() == 1) {
		TPZLinearAnalysis::Solve();
		if(fSolvers.NElements() == 0) {
			fSolvers.Push((TPZMatrixSolver<TVar> *) fSolver->Clone());
		}
		if(fPrecondition.NElements() == 0) {
			fPrecondition.Push(0);
		}
		if(fSolutions.NElements() == 0) {
			fSolutions.Push(new TPZSolutionMatrix(fSolution));
		} else {
			int nsol = fSolutions.NElements();
			*(fSolutions[nsol-1]) = fSolution;
		}
		return;
	}
	int numeq = fCompMesh->NEquations();
	if(fRhs.Rows() != numeq ) return;
	int nsolvers = fSolvers.NElements();
	
	TPZFMatrix<TVar> residual(fRhs);
	TPZFMatrix<TVar> delu(numeq,1,0.);
	TPZMatrixSolver<TVar> *solve = dynamic_cast<TPZMatrixSolver<TVar> *> (fSolvers[nsolvers-1]);
	if(fSolution.Rows() != numeq) {
		fSolution.Redim(numeq,1);
	} else {
		solve->Matrix()->Residual(fSolution,fRhs,residual);
	}
	
	REAL normrhs = Norm(fRhs);
	REAL normres  = Norm(residual);
	if(normrhs*1.e-6 >= normres) {
		cout << "TPZMGAnalysis::Solve no need for iterations normrhs = " << normrhs << " normres = " << normres << endl;
		if(fSolutions.NElements() < fMeshes.NElements()) {
			fSolutions.Push(new TPZSolutionMatrix(fSolution));
		} else {
			int nsol = fSolutions.NElements();
			*(fSolutions[nsol-1]) = fSolution;
		}
		return ;
	}
	
	TPZStepSolver<TVar> *stepsolve = dynamic_cast<TPZStepSolver<TVar> *> (solve);
	if(stepsolve) stepsolve->SetTolerance(1.e-6*normrhs/normres);
	cout << "TPZMGAnalysis::Run res : " << Norm(residual) << " neq " << numeq << endl;
	solve->Solve(residual, delu);
	TPZFMatrix<TVar> &mysol = fSolution;
	mysol += delu;

	fCompMesh->LoadSolution(fSolution);
	if(fSolutions.NElements() < fMeshes.NElements()) {
		fSolutions.Push(new TPZSolutionMatrix(fSolution));
	} else {
		int nsol = fSolutions.NElements();
		*(fSolutions[nsol-1]) = fSolution;
	}
}